

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRNetServer.cpp
# Opt level: O0

VRDataQueue * __thiscall
MinVR::VRNetServer::syncEventDataAcrossAllNodes(VRNetServer *this,VRDataQueue *eventQueue)

{
  bool bVar1;
  reference piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_RDX;
  VRDataQueue *in_RDI;
  iterator itr_1;
  serialData serializedEventQueue;
  serialData eventData;
  iterator itr;
  VRDataQueue *in_stack_00000348;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  string *in_stack_fffffffffffffed0;
  string local_100 [8];
  serialData *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff1c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_d8;
  string local_d0 [24];
  VRDataQueue *in_stack_ffffffffffffff48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff50;
  string local_98 [80];
  string local_48 [32];
  int *local_28;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20 [4];
  
  local_20[0]._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  while( true ) {
    local_28 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)
                                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    bVar1 = __gnu_cxx::operator<
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffed0,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (local_20);
    in_stack_fffffffffffffed0 = local_48;
    VRNetInterface::waitForAndReceiveEventData_abi_cxx11_(in_stack_ffffffffffffff1c);
    std::__cxx11::string::string(local_98,in_stack_fffffffffffffed0);
    VRDataQueue::VRDataQueue
              ((VRDataQueue *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    VRDataQueue::addQueue
              ((VRDataQueue *)in_stack_ffffffffffffff50._M_current,in_stack_ffffffffffffff48);
    VRDataQueue::~VRDataQueue((VRDataQueue *)0x13b6e0);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_48);
    in_stack_ffffffffffffff50 =
         __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                   (in_RDX,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  }
  VRDataQueue::serialize_abi_cxx11_(in_stack_00000348);
  local_d8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  while( true ) {
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    bVar1 = __gnu_cxx::operator<
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffed0,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_d8);
    in_stack_fffffffffffffecc = *piVar2;
    std::__cxx11::string::string(local_100,local_d0);
    VRNetInterface::sendEventData(in_stack_ffffffffffffff14,in_stack_ffffffffffffff08);
    std::__cxx11::string::~string(local_100);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (in_RDX,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  }
  VRDataQueue::VRDataQueue
            ((VRDataQueue *)in_stack_fffffffffffffed0,
             (VRDataQueue *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  std::__cxx11::string::~string(local_d0);
  return in_RDI;
}

Assistant:

VRDataQueue VRNetServer::syncEventDataAcrossAllNodes(VRDataQueue eventQueue) {

  // TODO: rather than a for loop, could use a select() system call
  // here (I think) to figure out which socket is ready for a read in
  // the situation where one client is ready but other(s) are not
  for (std::vector<SOCKET>::iterator itr=_clientSocketFDs.begin();
       itr < _clientSocketFDs.end(); itr++) {
    VRDataQueue::serialData eventData = waitForAndReceiveEventData(*itr);

    eventQueue.addQueue(eventData);
  }

  VRDataQueue::serialData serializedEventQueue = eventQueue.serialize();
  // 2. send new combined inputEvents array out to all clients
  for (std::vector<SOCKET>::iterator itr=_clientSocketFDs.begin();
       itr < _clientSocketFDs.end(); itr++) {
    sendEventData(*itr, serializedEventQueue);
  }

  return eventQueue;
}